

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O3

void __thiscall
cbtTaskSchedulerDefault::parallelFor
          (cbtTaskSchedulerDefault *this,int iBegin,int iEnd,int grainSize,cbtIParallelForBody *body
          )

{
  cbtSpinMutex *this_00;
  int iVar1;
  JobQueue *this_01;
  char *pcVar2;
  bool bVar3;
  int jobCount;
  int iVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  CProfileSample __profile_1;
  CProfileSample __profile;
  CProfileSample local_4a;
  CProfileSample local_49;
  ulong local_48;
  cbtIParallelForBody *local_40;
  cbtSpinMutex *local_38;
  
  uVar5 = (ulong)(uint)grainSize;
  local_40 = body;
  CProfileSample::CProfileSample(&local_49,"parallelFor_ThreadSupport");
  local_48 = uVar5;
  if ((grainSize < iEnd - iBegin) && (0 < this->m_numWorkerThreads)) {
    this_00 = &this->m_antiNestingLock;
    bVar3 = cbtSpinMutex::tryLock(this_00);
    if (bVar3) {
      jobCount = ((int)local_48 + -1 + (iEnd - iBegin)) / (int)local_48;
      this->m_numJobs = jobCount;
      local_38 = this_00;
      if (0 < this->m_numActiveJobQueues) {
        lVar8 = 0;
        lVar7 = 0;
        do {
          JobQueue::clearQueue
                    ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar8 + -0x78),
                     jobCount,0x18);
          lVar7 = lVar7 + 1;
          lVar8 = lVar8 + 0xb8;
        } while (lVar7 < this->m_numActiveJobQueues);
      }
      prepareWorkerThreads(this);
      if (iBegin < iEnd) {
        iVar6 = 1;
        do {
          this_01 = (this->m_perThreadJobQueues).m_data[iVar6];
          iVar1 = this_01->m_allocSize;
          pcVar2 = this_01->m_jobMem;
          this_01->m_allocSize = iVar1 + 0x18;
          *(undefined ***)(pcVar2 + iVar1) = &PTR_executeJob_00b4bee0;
          *(cbtIParallelForBody **)(pcVar2 + (long)iVar1 + 8) = local_40;
          *(int *)(pcVar2 + (long)iVar1 + 0x10) = iBegin;
          iBegin = iBegin + (int)local_48;
          iVar4 = iEnd;
          if (iBegin < iEnd) {
            iVar4 = iBegin;
          }
          *(int *)(pcVar2 + (long)iVar1 + 0x14) = iVar4;
          JobQueue::submitJob(this_01,(IJob *)(pcVar2 + iVar1));
          iVar6 = iVar6 + 1;
          if (this->m_numThreads <= iVar6) {
            iVar6 = 1;
          }
        } while (iBegin < iEnd);
      }
      wakeWorkers(this,jobCount + -1);
      waitJobs(this);
      cbtSpinMutex::unlock(local_38);
      goto LAB_008f4f94;
    }
  }
  CProfileSample::CProfileSample(&local_4a,"parallelFor_mainThread");
  (*local_40->_vptr_cbtIParallelForBody[2])(local_40,(ulong)(uint)iBegin,(ulong)(uint)iEnd);
  CProfileSample::~CProfileSample(&local_4a);
LAB_008f4f94:
  CProfileSample::~CProfileSample(&local_49);
  return;
}

Assistant:

virtual void parallelFor(int iBegin, int iEnd, int grainSize, const cbtIParallelForBody& body) BT_OVERRIDE
	{
		BT_PROFILE("parallelFor_ThreadSupport");
		cbtAssert(iEnd >= iBegin);
		cbtAssert(grainSize >= 1);
		int iterationCount = iEnd - iBegin;
		if (iterationCount > grainSize && m_numWorkerThreads > 0 && m_antiNestingLock.tryLock())
		{
			typedef ParallelForJob JobType;
			int jobCount = (iterationCount + grainSize - 1) / grainSize;
			m_numJobs = jobCount;
			cbtAssert(jobCount >= 2);  // need more than one job for multithreading
			int jobSize = sizeof(JobType);

			for (int i = 0; i < m_numActiveJobQueues; ++i)
			{
				m_jobQueues[i].clearQueue(jobCount, jobSize);
			}
			// prepare worker threads for incoming work
			prepareWorkerThreads();
			// submit all of the jobs
			int iJob = 0;
			int iThread = kFirstWorkerThreadId;  // first worker thread
			for (int i = iBegin; i < iEnd; i += grainSize)
			{
				cbtAssert(iJob < jobCount);
				int iE = cbtMin(i + grainSize, iEnd);
				JobQueue* jq = m_perThreadJobQueues[iThread];
				cbtAssert(jq);
				cbtAssert((jq - &m_jobQueues[0]) < m_numActiveJobQueues);
				void* jobMem = jq->allocJobMem(jobSize);
				JobType* job = new (jobMem) ParallelForJob(i, iE, body);  // placement new
				jq->submitJob(job);
				iJob++;
				iThread++;
				if (iThread >= m_numThreads)
				{
					iThread = kFirstWorkerThreadId;  // first worker thread
				}
			}
			wakeWorkers(jobCount - 1);

			// put the main thread to work on emptying the job queue and then wait for all workers to finish
			waitJobs();
			m_antiNestingLock.unlock();
		}
		else
		{
			BT_PROFILE("parallelFor_mainThread");
			// just run on main thread
			body.forLoop(iBegin, iEnd);
		}
	}